

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString __thiscall SimpleString::printable(SimpleString *this)

{
  bool bVar1;
  char *s1;
  char *s2;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  undefined8 extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t sVar2;
  long *in_RSI;
  SimpleString *in_RDI;
  SimpleString SVar3;
  SimpleString hexEscapeCode;
  char c;
  size_t i;
  size_t j;
  size_t str_size;
  SimpleString *result;
  char *in_stack_ffffffffffffff68;
  SimpleString *in_stack_ffffffffffffff70;
  SimpleString *this_00;
  char local_58 [23];
  char local_41;
  ulong local_40;
  long local_38;
  ulong local_30;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  SimpleString(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  getPrintableSize(this_00);
  setInternalBufferToNewBuffer(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
  local_30 = size((SimpleString *)0x10ea84);
  local_38 = 0;
  sVar2 = extraout_RDX;
  for (local_40 = 0; local_40 < local_30; local_40 = local_40 + 1) {
    local_41 = *(char *)(*in_RSI + local_40);
    bVar1 = isControlWithShortEscapeSequence(local_41);
    if (bVar1) {
      StrNCpy(in_RDI->buffer_ + local_38,printable::shortEscapeCodes[(int)local_41 - 7U & 0xff],2);
      local_38 = local_38 + 2;
      sVar2 = extraout_RDX_00;
    }
    else {
      bVar1 = isControl(local_41);
      if (bVar1) {
        StringFromFormat(local_58,"\\x%02X ",(ulong)(uint)(int)local_41);
        s1 = in_RDI->buffer_ + local_38;
        s2 = asCharString((SimpleString *)0x10eb8f);
        StrNCpy(s1,s2,4);
        local_38 = local_38 + 4;
        ~SimpleString((SimpleString *)0x10ebc1);
        sVar2 = extraout_RDX_02;
      }
      else {
        sVar2 = CONCAT71((int7)((ulong)extraout_RDX_01 >> 8),local_41);
        in_RDI->buffer_[local_38] = local_41;
        local_38 = local_38 + 1;
      }
    }
  }
  in_RDI->buffer_[local_38] = '\0';
  SVar3.bufferSize_ = sVar2;
  SVar3.buffer_ = (char *)this_00;
  return SVar3;
}

Assistant:

SimpleString SimpleString::printable() const
{
    static const char* shortEscapeCodes[] =
    {
        "\\a",
        "\\b",
        "\\t",
        "\\n",
        "\\v",
        "\\f",
        "\\r"
    };

    SimpleString result;
    result.setInternalBufferToNewBuffer(getPrintableSize() + 1);

    size_t str_size = size();
    size_t j = 0;
    for (size_t i = 0; i < str_size; i++)
    {
        char c = buffer_[i];
        if (isControlWithShortEscapeSequence(c))
        {
            StrNCpy(&result.buffer_[j], shortEscapeCodes[(unsigned char)(c - '\a')], 2);
            j += 2;
        }
        else if (isControl(c))
        {
            SimpleString hexEscapeCode = StringFromFormat("\\x%02X ", c);
            StrNCpy(&result.buffer_[j], hexEscapeCode.asCharString(), 4);
            j += 4;
        }
        else
        {
            result.buffer_[j] = c;
            j++;
        }
    }
    result.buffer_[j] = 0;

    return result;
}